

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_get_nth_idx_test(btree_kv_ops *kv_ops)

{
  bnode *__ptr;
  long in_RDI;
  idx_t location;
  idx_t den;
  idx_t num;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  short local_66 [5];
  timeval local_18;
  long local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = dummy_node((uint8_t)((ulong)stack0xffffffffffffffa0 >> 0x38),
                     (uint8_t)((ulong)stack0xffffffffffffffa0 >> 0x30),
                     (uint16_t)((ulong)stack0xffffffffffffffa0 >> 0x20));
  __ptr->nentry = 4;
  local_66[2] = 3;
  local_66[1] = 4;
  (**(code **)(local_8 + 0x50))(__ptr,3,4,local_66);
  if (local_66[0] != 3) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x2cb);
    kv_get_nth_idx_test::__test_pass = 0;
    if (local_66[0] != 3) {
      __assert_fail("location == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x2cb,"void kv_get_nth_idx_test(btree_kv_ops *)");
    }
  }
  local_66[2] = 1;
  local_66[1] = 4;
  (**(code **)(local_8 + 0x50))(__ptr,1,4,local_66);
  if (local_66[0] != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x2d1);
    kv_get_nth_idx_test::__test_pass = 0;
    if (local_66[0] != 1) {
      __assert_fail("location == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x2d1,"void kv_get_nth_idx_test(btree_kv_ops *)");
    }
  }
  local_66[2] = 0;
  local_66[1] = 3;
  (**(code **)(local_8 + 0x50))(__ptr,0,3,local_66);
  if (local_66[0] != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x2d7);
    kv_get_nth_idx_test::__test_pass = 0;
    if (local_66[0] != 0) {
      __assert_fail("location == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x2d7,"void kv_get_nth_idx_test(btree_kv_ops *)");
    }
  }
  free(__ptr);
  memleak_end();
  if (kv_get_nth_idx_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_get_nth_idx_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_get_nth_idx_test");
  }
  return;
}

Assistant:

void kv_get_nth_idx_test(btree_kv_ops *kv_ops)
{

    TEST_INIT();
    memleak_start();

    bnoderef node;
    idx_t num, den, location;

    node = dummy_node(0, 0, 0);
    node->nentry = 4;
    num = 3;
    den = 4;

    // verify 3/4th offset
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 3);

    // verify 1/4 offset
    num = 1;
    den = 4;
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 1);

     // verify with num == 0
    num = 0;
    den = 3;
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 0);

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_nth_idx_test");
}